

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O1

TextureId __thiscall
CS248::GLResourceManager::createColorTextureFromFrameBuffer
          (GLResourceManager *this,FrameBufferId fbid,int texture_size)

{
  GLuint GVar1;
  TextureId texid;
  FrameBufferId fbid_00;
  GLuint id;
  undefined4 uStack_1c;
  
  texid.id = (GLuint)&id;
  glGenTextures(1);
  GVar1 = id;
  bindTexture((GLResourceManager *)&id,texid);
  glTexImage2D(0xde1,0,0x1907,texture_size,texture_size,0,0x1908,0x1401,0);
  glTexParameteri(0xde1,0x2800,0x2600);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2802,0x812f);
  fbid_00.id = 0x2803;
  glTexParameteri(0xde1,0x2803,0x812f);
  if ((long *)CONCAT44(uStack_1c,id) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_1c,id) + 8))();
  }
  bindFrameBuffer((GLResourceManager *)&id,fbid_00);
  (*__glewFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,GVar1,0);
  if ((long *)CONCAT44(uStack_1c,id) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_1c,id) + 8))();
  }
  return (TextureId)GVar1;
}

Assistant:

TextureId GLResourceManager::createColorTextureFromFrameBuffer(FrameBufferId fbid, int texture_size) {
  TextureId texid = createTexture();
  {
  	auto tex_bind = bindTexture(texid);
  	glTexImage2D(GL_TEXTURE_2D, /*level=*/0, GL_RGB, /*width=*/texture_size,
        /*height=*/texture_size, /*border=*/0, GL_RGBA, GL_UNSIGNED_BYTE, /*data=*/0);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
  }
  {
    auto fb_bind = bindFrameBuffer(fbid);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texid.id, /*level=*/0);
  }
  return texid; 
}